

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *generation_options,string *out_error)

{
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  FileDescriptor *pFVar3;
  string *psVar4;
  bool bVar5;
  __type _Var6;
  const_iterator cVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  char *pcVar11;
  string other_package_for_prefix;
  string prefix;
  string package;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Options *local_1d8;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  key_type local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &local_e0._M_impl.super__Rb_tree_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8 = generation_options;
  local_188 = files;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((generation_options->expected_prefixes_path)._M_string_length != 0) {
    local_1c8._M_dataplus._M_p = (pointer)&PTR__LineConsumer_00426c90;
    local_1c8._M_string_length = (size_type)&local_e0;
    bVar5 = ParseSimpleFile(&generation_options->expected_prefixes_path,(LineConsumer *)&local_1c8,
                            out_error);
    if (!bVar5) {
LAB_00260c5d:
      bVar5 = false;
      goto LAB_00260c5f;
    }
  }
  local_1d0 = out_error;
  for (uVar10 = 0;
      ppFVar2 = (local_188->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(local_188->
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
      uVar10 = uVar10 + 1) {
    pFVar3 = ppFVar2[uVar10];
    std::__cxx11::string::string((string *)&local_1c8,*(string **)(*(long *)(pFVar3 + 0xa0) + 0x80))
    ;
    std::__cxx11::string::string((string *)&local_100,*(string **)(pFVar3 + 8));
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_e0,&local_100);
    if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
      if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_1c8._M_string_length !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        if (0x19 < (byte)(*local_1c8._M_dataplus._M_p + 0xbfU)) {
          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          poVar8 = std::operator<<(poVar8,
                                   "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
          poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
          poVar8 = std::operator<<(poVar8,"\";\' in \'");
          poVar8 = std::operator<<(poVar8,*(string **)pFVar3);
          poVar8 = std::operator<<(poVar8,"\';");
          poVar8 = std::operator<<(poVar8," it should start with a capital letter.");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::ostream::flush();
        }
        if (local_1c8._M_string_length <
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x3) {
          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          poVar8 = std::operator<<(poVar8,
                                   "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
          poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
          poVar8 = std::operator<<(poVar8,"\";\' in \'");
          poVar8 = std::operator<<(poVar8,*(string **)pFVar3);
          poVar8 = std::operator<<(poVar8,"\';");
          poVar8 = std::operator<<(poVar8,
                                   " Apple recommends they should be at least 3 characters long.");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::ostream::flush();
        }
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_local_buf[0] = '\0';
        for (p_Var9 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)
            ) {
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var9 + 2),&local_1c8);
          if (_Var6) {
            std::__cxx11::string::_M_assign((string *)&local_1f8);
            break;
          }
        }
        if (local_100._M_string_length == 0) {
          if (local_1f8._M_string_length == 0) {
            poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            poVar8 = std::operator<<(poVar8,"protoc:0: warning: File \'");
            poVar8 = std::operator<<(poVar8,*(string **)pFVar3);
            poVar8 = std::operator<<(poVar8,"\' has no ");
            poVar8 = std::operator<<(poVar8,
                                     "package. Consider adding a new package to the proto and adding \'"
                                    );
            poVar8 = std::operator<<(poVar8,"new.package = ");
            poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
            pcVar11 = "\' to the expected prefixes file (";
          }
          else {
            poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            poVar8 = std::operator<<(poVar8,"protoc:0: warning: File \'");
            poVar8 = std::operator<<(poVar8,*(string **)pFVar3);
            poVar8 = std::operator<<(poVar8,"\' has no package ");
            poVar8 = std::operator<<(poVar8,"and package \'");
            poVar8 = std::operator<<(poVar8,(string *)&local_1f8);
            poVar8 = std::operator<<(poVar8,"\' already uses \'");
            poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
            poVar8 = std::operator<<(poVar8,
                                     "\' as its prefix. Consider either adding a new package ");
            poVar8 = std::operator<<(poVar8,
                                     "to the proto, or reusing one of the packages already using this "
                                    );
            pcVar11 = "prefix in the expected prefixes file (";
          }
LAB_00260aa3:
          poVar8 = std::operator<<(poVar8,pcVar11);
          poVar8 = std::operator<<(poVar8,(string *)local_1d8);
          poVar8 = std::operator<<(poVar8,").");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::ostream::flush();
        }
        else {
          if (local_1f8._M_string_length != 0) {
            std::operator+(&local_b0,"error: Found \'option objc_class_prefix = \"",&local_1c8);
            std::operator+(&local_90,&local_b0,"\";\' in \'");
            psVar4 = local_1d0;
            std::operator+(&local_70,&local_90,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            pFVar3);
            std::operator+(&local_50,&local_70,"\'; that prefix is already used for \'package ");
            std::operator+(&local_180,&local_50,&local_1f8);
            std::operator+(&local_160,&local_180,";\'. It can only be reused by listing ");
            std::operator+(&local_140,&local_160,"it in the expected file (");
            std::operator+(&local_120,&local_140,&local_1d8->expected_prefixes_path);
            std::operator+(&local_1a8,&local_120,").");
            std::__cxx11::string::operator=((string *)psVar4,(string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_1f8);
            goto LAB_00260c46;
          }
          if (local_e0._M_impl.super__Rb_tree_header._M_node_count != 0) {
            poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            poVar8 = std::operator<<(poVar8,
                                     "protoc:0: warning: Found unexpected \'option objc_class_prefix = \""
                                    );
            poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
            poVar8 = std::operator<<(poVar8,"\";\' in \'");
            poVar8 = std::operator<<(poVar8,*(string **)pFVar3);
            poVar8 = std::operator<<(poVar8,"\';");
            pcVar11 = " consider adding it to the expected prefixes file (";
            goto LAB_00260aa3;
          }
        }
        std::__cxx11::string::~string((string *)&local_1f8);
      }
    }
    else {
      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (cVar7._M_node + 2),&local_1c8);
      if (!_Var6) {
        std::operator+(&local_180,"error: Expected \'option objc_class_prefix = \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (cVar7._M_node + 2));
        std::operator+(&local_160,&local_180,"\";\' for package \'");
        psVar4 = local_1d0;
        std::operator+(&local_140,&local_160,&local_100);
        std::operator+(&local_120,&local_140,"\' in \'");
        std::operator+(&local_1a8,&local_120,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar3
                      );
        std::operator+(&local_1f8,&local_1a8,"\'");
        std::__cxx11::string::operator=((string *)psVar4,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1c8._M_string_length !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          std::operator+(&local_1a8,"; but found \'",&local_1c8);
          std::operator+(&local_1f8,&local_1a8,"\' instead");
          std::__cxx11::string::append((string *)psVar4);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_1a8);
        }
        std::__cxx11::string::append((char *)psVar4);
LAB_00260c46:
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_1c8);
        goto LAB_00260c5d;
      }
    }
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar5 = true;
LAB_00260c5f:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e0);
  return bVar5;
}

Assistant:

bool ValidateObjCClassPrefixes(const vector<const FileDescriptor*>& files,
                               const Options& generation_options,
                               string* out_error) {
  // Load the expected package prefixes, if available, to validate against.
  map<string, string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(generation_options,
                                   &expected_package_prefixes,
                                   out_error)) {
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    bool is_valid =
        ValidateObjCClassPrefix(files[i],
                                generation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}